

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_cost(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  object_kind *poVar3;
  object_kind *k;
  artifact *a;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    poVar3 = lookup_kind(*(wchar_t *)((long)pvVar2 + 0x20),*(wchar_t *)((long)pvVar2 + 0x24));
    if (poVar3 == (object_kind *)0x0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                    ,0xae5,"enum parser_error parse_artifact_cost(struct parser *)");
    }
    wVar1 = parser_getint(p,"cost");
    *(wchar_t *)((long)pvVar2 + 0x44) = wVar1;
    if ((uint)z_info->ordinary_kind_max <= poVar3->kidx) {
      poVar3->cost = *(int *)((long)pvVar2 + 0x44);
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_artifact_cost(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct object_kind *k;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	k = lookup_kind(a->tval, a->sval);
	assert(k);
	a->cost = parser_getint(p, "cost");
	/* Set kind cost for special artifacts */
	if (k->kidx >= z_info->ordinary_kind_max) {
		k->cost = a->cost;
	}
	return PARSE_ERROR_NONE;
}